

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O1

optional<QJsonDocument> __thiscall QRestReply::readJson(QRestReply *this,QJsonParseError *error)

{
  bool bVar1;
  QLoggingCategory *this_00;
  undefined8 *in_RDX;
  undefined8 *extraout_RDX;
  undefined8 *puVar2;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  undefined8 *extraout_RDX_02;
  long in_FS_OFFSET;
  optional<QJsonDocument> oVar3;
  QJsonDocument doc;
  QJsonParseError parseError;
  QByteArray local_60;
  undefined1 *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = in_RDX;
  if (((*error != (QJsonParseError)0x0) && (*(int *)((long)*error + 4) != 0)) &&
     (error[1] != (QJsonParseError)0x0)) {
    bVar1 = QNetworkReply::isFinished((QNetworkReply *)error[1]);
    if (bVar1) {
      local_40 = 0xffffffff;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_60.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_60.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QIODevice::readAll();
      local_60.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QJsonDocument::fromJson(&local_60,(QJsonParseError *)&local_60.d.ptr);
      if (in_RDX != (undefined8 *)0x0) {
        *in_RDX = local_40;
      }
      bVar1 = local_40._4_4_ == 0;
      if (bVar1) {
        QJsonDocument::QJsonDocument((QJsonDocument *)this,(QJsonDocument *)&local_60);
      }
      *(bool *)&(this->wrapped).wp.value = bVar1;
      QJsonDocument::~QJsonDocument((QJsonDocument *)&local_60);
      puVar2 = extraout_RDX_00;
      if ((QArrayData *)local_60.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_60.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_60.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_60.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_60.d.ptr,1,0x10);
          puVar2 = extraout_RDX_01;
        }
      }
      goto LAB_002241a8;
    }
    this_00 = QtPrivateLogging::lcQrest();
    puVar2 = extraout_RDX;
    if (((this_00->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      readJson((QRestReply *)this_00);
      puVar2 = extraout_RDX_02;
    }
  }
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = 0;
  }
  *(undefined1 *)&(this->wrapped).wp.value = 0;
LAB_002241a8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  oVar3.super__Optional_base<QJsonDocument,_false,_false>._M_payload.
  super__Optional_payload<QJsonDocument,_true,_false,_false>.
  super__Optional_payload_base<QJsonDocument>._8_8_ = puVar2;
  oVar3.super__Optional_base<QJsonDocument,_false,_false>._M_payload.
  super__Optional_payload<QJsonDocument,_true,_false,_false>.
  super__Optional_payload_base<QJsonDocument>._M_payload = (_Storage<QJsonDocument,_false>)this;
  return (optional<QJsonDocument>)
         oVar3.super__Optional_base<QJsonDocument,_false,_false>._M_payload.
         super__Optional_payload<QJsonDocument,_true,_false,_false>.
         super__Optional_payload_base<QJsonDocument>;
}

Assistant:

std::optional<QJsonDocument> QRestReply::readJson(QJsonParseError *error)
{
    if (!wrapped) {
        if (error)
            *error = {0, QJsonParseError::ParseError::NoError};
        return std::nullopt;
    }

    if (!wrapped->isFinished()) {
        qCWarning(lcQrest, "readJson() called on an unfinished reply, ignoring");
        if (error)
            *error = {0, QJsonParseError::ParseError::NoError};
        return std::nullopt;
    }
    QJsonParseError parseError;
    const QByteArray data = wrapped->readAll();
    const QJsonDocument doc = QJsonDocument::fromJson(data, &parseError);
    if (error)
        *error = parseError;
    if (parseError.error)
        return std::nullopt;
    return doc;
}